

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioSerialReadClose(uint gpio)

{
  ulong uVar1;
  FILE *pFVar2;
  char *__format;
  int iVar3;
  
  pFVar2 = _stderr;
  uVar1 = (ulong)gpio;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar2,"%s %s: gpio=%d\n",myTimeStamp::buf,"gpioSerialReadClose",uVar1);
  }
  pFVar2 = _stderr;
  if (libInitialised == '\0') {
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    fprintf(pFVar2,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
            "gpioSerialReadClose");
    return -0x1f;
  }
  if (gpio < 0x20) {
    if (wfRx[uVar1].mode == 1) {
      free(wfRx[uVar1].field_4.s.buf);
      gpioSetWatchdog(gpio,0);
      gpioSetAlertFunc(gpio,(gpioAlertFunc_t)0x0);
      wfRx[uVar1].mode = 0;
      return 0;
    }
    if (wfRx[uVar1].mode != 0) {
      return 0;
    }
    iVar3 = -0x26;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x26;
    }
    myTimeStamp();
    __format = "%s %s: no serial read on gpio (%d)\n";
  }
  else {
    iVar3 = -2;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -2;
    }
    myTimeStamp();
    __format = "%s %s: bad gpio (%d)\n";
  }
  fprintf(pFVar2,__format,myTimeStamp::buf,"gpioSerialReadClose",uVar1);
  return iVar3;
}

Assistant:

int gpioSerialReadClose(unsigned gpio)
{
   DBG(DBG_USER, "gpio=%d", gpio);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   switch(wfRx[gpio].mode)
   {
      case PI_WFRX_NONE:

         SOFT_ERROR(PI_NOT_SERIAL_GPIO, "no serial read on gpio (%d)", gpio);

         break;

      case PI_WFRX_SERIAL:

         free(wfRx[gpio].s.buf);

         gpioSetWatchdog(gpio, 0); /* switch off timeouts */

         gpioSetAlertFunc(gpio, NULL); /* cancel alert */

         wfRx[gpio].mode = PI_WFRX_NONE;

         break;
   }

   return 0;
}